

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_CHANNEL * channel_forward_accept(LIBSSH2_LISTENER *listener)

{
  int iVar1;
  void *pvVar2;
  LIBSSH2_CHANNEL *channel;
  int rc;
  LIBSSH2_LISTENER *listener_local;
  
  do {
    iVar1 = _libssh2_transport_read(listener->session);
  } while (0 < iVar1);
  pvVar2 = _libssh2_list_first(&listener->queue);
  if (pvVar2 == (void *)0x0) {
    if (iVar1 == -0x25) {
      _libssh2_error(listener->session,-0x25,"Would block waiting for packet");
    }
    else {
      _libssh2_error(listener->session,-0x17,"Channel not found");
    }
    listener_local = (LIBSSH2_LISTENER *)0x0;
  }
  else {
    listener_local = (LIBSSH2_LISTENER *)_libssh2_list_first(&listener->queue);
    _libssh2_list_remove((list_node *)listener_local);
    listener->queue_size = listener->queue_size + -1;
    _libssh2_list_add((list_head *)(listener_local[1].node.prev + 0x17),(list_node *)listener_local)
    ;
  }
  return (LIBSSH2_CHANNEL *)listener_local;
}

Assistant:

static LIBSSH2_CHANNEL *
channel_forward_accept(LIBSSH2_LISTENER *listener)
{
    int rc;

    do {
        rc = _libssh2_transport_read(listener->session);
    } while(rc > 0);

    if(_libssh2_list_first(&listener->queue)) {
        LIBSSH2_CHANNEL *channel = _libssh2_list_first(&listener->queue);

        /* detach channel from listener's queue */
        _libssh2_list_remove(&channel->node);

        listener->queue_size--;

        /* add channel to session's channel list */
        _libssh2_list_add(&channel->session->channels, &channel->node);

        return channel;
    }

    if(rc == LIBSSH2_ERROR_EAGAIN) {
        _libssh2_error(listener->session, LIBSSH2_ERROR_EAGAIN,
                       "Would block waiting for packet");
    }
    else
        _libssh2_error(listener->session, LIBSSH2_ERROR_CHANNEL_UNKNOWN,
                       "Channel not found");
    return NULL;
}